

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Inline_Map_AST_Node::eval_internal(Inline_Map_AST_Node *this,Dispatch_State *t_ss)

{
  long lVar1;
  string *t_name;
  Dispatch_Engine *this_00;
  Inline_Map_AST_Node *pIVar2;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *this_01;
  long *plVar3;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar4;
  initializer_list<chaiscript::Boxed_Value> __l;
  allocator_type local_f2;
  allocator local_f1;
  undefined8 *local_f0;
  Inline_Map_AST_Node *local_e8;
  undefined8 *local_e0;
  reference_wrapper<chaiscript::detail::Stack_Holder> *local_d8;
  long *local_d0;
  Boxed_Value obj;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  retval;
  Result_Type local_60;
  undefined1 local_40 [16];
  
  retval._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &retval._M_t._M_impl.super__Rb_tree_header._M_header;
  retval._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  retval._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  retval._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar1 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
  local_d0 = *(long **)(lVar1 + 0x68);
  local_d8 = &t_ss[4].m_stack_holder;
  local_e0 = in_RDX + 2;
  local_f0 = in_RDX;
  local_e8 = this;
  retval._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       retval._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (plVar3 = *(long **)(lVar1 + 0x60); pIVar2 = local_e8, plVar3 != local_d0; plVar3 = plVar3 + 2
      ) {
    AST_Node::eval((AST_Node *)&obj,*(Dispatch_State **)(*(long *)(*plVar3 + 0x60) + 0x10));
    if ((obj.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->m_return_value == false) {
      t_name = (string *)*in_RDX;
      std::__cxx11::string::string((string *)&local_60,"clone",&local_f1);
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&obj);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_b8;
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 &stack0xffffffffffffff58,__l,&local_f2);
      chaiscript::detail::Dispatch_Engine::call_function
                ((Dispatch_Engine *)local_40,t_name,(atomic_uint_fast32_t *)&local_60,
                 (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 local_d8,(Type_Conversions_State *)&stack0xffffffffffffff58);
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&obj,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_40
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 &stack0xffffffffffffff58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      std::__cxx11::string::~string((string *)&local_60);
      in_RDX = local_f0;
    }
    this_00 = (Dispatch_Engine *)*in_RDX;
    AST_Node::eval((AST_Node *)&stack0xffffffffffffff58,
                   (Dispatch_State *)**(undefined8 **)(*plVar3 + 0x60));
    chaiscript::detail::Dispatch_Engine::boxed_cast<std::__cxx11::string>
              (&local_60,this_00,(Boxed_Value *)&stack0xffffffffffffff58);
    this_01 = (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              ::operator[](&retval,&local_60);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,(__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                       &obj);
    std::__cxx11::string::~string((string *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  chaiscript::detail::
  const_var_impl<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&retval._M_t);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)pIVar2;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          try {
            std::map<std::string, Boxed_Value> retval;

            for (const auto &child : children[0]->children) {
              auto obj = child->children[1]->eval(t_ss);
              if (!obj.is_return_value()) {
                obj = t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions());
              }

              retval[t_ss->boxed_cast<std::string>(child->children[0]->eval(t_ss))] = std::move(obj);
            }

            return const_var(std::move(retval));
          }
          catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate copy constructor or 'clone' while inserting into Map.", e.parameters, e.functions, false, *t_ss);
          }
        }